

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_node.cpp
# Opt level: O1

void __thiscall duckdb::QueryNode::AddDistinct(QueryNode *this)

{
  ResultModifierType RVar1;
  bool bVar2;
  reference this_00;
  type this_01;
  DistinctModifier *pDVar3;
  int iVar4;
  pointer *__ptr;
  size_type __n;
  _Head_base<0UL,_duckdb::ResultModifier_*,_false> local_18;
  
  __n = (long)(this->modifiers).
              super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->modifiers).
              super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3;
  do {
    __n = __n - 1;
    if (__n == 0xffffffffffffffff) {
      iVar4 = 2;
      break;
    }
    this_00 = vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
              ::operator[](&this->modifiers,__n);
    this_01 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
              ::operator*(this_00);
    RVar1 = this_01->type;
    iVar4 = 2;
    bVar2 = false;
    if ((RVar1 != LIMIT_MODIFIER) && (bVar2 = false, RVar1 != LIMIT_PERCENT_MODIFIER)) {
      if ((RVar1 == DISTINCT_MODIFIER) &&
         (pDVar3 = ResultModifier::Cast<duckdb::DistinctModifier>(this_01),
         (pDVar3->distinct_on_targets).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (pDVar3->distinct_on_targets).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        iVar4 = 1;
        bVar2 = false;
      }
      else {
        iVar4 = 0;
        bVar2 = true;
      }
    }
  } while (bVar2);
  if (iVar4 == 2) {
    local_18._M_head_impl = (ResultModifier *)operator_new(0x28);
    (local_18._M_head_impl)->type = DISTINCT_MODIFIER;
    (local_18._M_head_impl)->_vptr_ResultModifier = (_func_int **)&PTR__DistinctModifier_0247f0c0;
    local_18._M_head_impl[1]._vptr_ResultModifier = (_func_int **)0x0;
    *(undefined8 *)&local_18._M_head_impl[1].type = 0;
    local_18._M_head_impl[2]._vptr_ResultModifier = (_func_int **)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&this->modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)&local_18);
    if (local_18._M_head_impl != (ResultModifier *)0x0) {
      (*(local_18._M_head_impl)->_vptr_ResultModifier[1])();
    }
  }
  return;
}

Assistant:

void QueryNode::AddDistinct() {
	// check if we already have a DISTINCT modifier
	for (idx_t modifier_idx = modifiers.size(); modifier_idx > 0; modifier_idx--) {
		auto &modifier = *modifiers[modifier_idx - 1];
		if (modifier.type == ResultModifierType::DISTINCT_MODIFIER) {
			auto &distinct_modifier = modifier.Cast<DistinctModifier>();
			if (distinct_modifier.distinct_on_targets.empty()) {
				// we have a DISTINCT without an ON clause - this distinct does not need to be added
				return;
			}
		} else if (modifier.type == ResultModifierType::LIMIT_MODIFIER ||
		           modifier.type == ResultModifierType::LIMIT_PERCENT_MODIFIER) {
			// we encountered a LIMIT or LIMIT PERCENT - these change the result of DISTINCT, so we do need to push a
			// DISTINCT relation
			break;
		}
	}
	modifiers.push_back(make_uniq<DistinctModifier>());
}